

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O2

Token * __thiscall Lexer::make_token(Token *__return_storage_ptr__,Lexer *this,TOKEN_SYN syn)

{
  int32_t iVar1;
  
  (__return_storage_ptr__->token)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->token).field_2;
  (__return_storage_ptr__->token)._M_string_length = 0;
  (__return_storage_ptr__->token).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->syn = syn;
  std::__cxx11::string::assign((char *)&__return_storage_ptr__->token);
  (__return_storage_ptr__->start_pos).index = (this->current_index).index;
  iVar1 = (this->current_index).col;
  (__return_storage_ptr__->start_pos).row = (this->current_index).row;
  (__return_storage_ptr__->start_pos).col = iVar1;
  return __return_storage_ptr__;
}

Assistant:

Token Lexer::make_token(TOKEN_SYN syn) {
    Token token;
    token.syn = syn;
    token.token = "";
    token.start_pos = current_index;
    return token;
}